

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

AWeapon * __thiscall FWeaponSlots::PickNextWeapon(FWeaponSlots *this,player_t *player)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  AWeapon *pAVar6;
  uint uVar7;
  PClassWeapon *type;
  uint uVar8;
  int startindex;
  int startslot;
  uint local_50;
  int local_4c;
  player_t *local_48;
  uint local_3c;
  FWeaponSlots *local_38;
  
  if (player->mo == (APlayerPawn *)0x0) {
    pAVar6 = (AWeapon *)0x0;
  }
  else {
    local_48 = player;
    if ((player->ReadyWeapon == (AWeapon *)0x0) ||
       (bVar3 = FindMostRecentWeapon(player,&local_4c,(int *)&local_50), bVar3)) {
      if (local_48->ReadyWeapon == (AWeapon *)0x0) {
        local_4c = 9;
        local_50 = this->Slots[9].Weapons.Count - 1;
      }
      local_3c = 0;
      iVar5 = local_4c;
      uVar8 = local_50;
      local_38 = this;
      do {
        uVar7 = uVar8 + 1;
        iVar2 = iVar5 + 1;
        if (8 < iVar5) {
          iVar2 = 0;
        }
        uVar1 = local_38->Slots[iVar5].Weapons.Count;
        uVar8 = 0;
        if ((int)uVar7 < (int)uVar1) {
          uVar8 = uVar7;
          iVar2 = iVar5;
        }
        iVar5 = iVar2;
        if (uVar8 < local_38->Slots[iVar5].Weapons.Count) {
          type = local_38->Slots[iVar5].Weapons.Array[(int)uVar8].Type;
        }
        else {
          type = (PClassWeapon *)0x0;
        }
        pAVar6 = (AWeapon *)
                 AActor::FindInventory(&local_48->mo->super_AActor,(PClassActor *)type,false);
        if (pAVar6 == (AWeapon *)0x0) {
LAB_004afa14:
          bVar3 = true;
          pAVar6 = (AWeapon *)this;
        }
        else {
          bVar3 = false;
          bVar4 = AWeapon::CheckAmmo(pAVar6,2,false,false,-1);
          if (!bVar4) goto LAB_004afa14;
        }
        this = (FWeaponSlots *)pAVar6;
        if (!bVar3) {
          return (AWeapon *)this;
        }
        local_3c = local_3c + ((int)uVar1 <= (int)uVar7);
      } while (((iVar5 != local_4c) || (uVar8 != local_50)) && (local_3c < 0xb));
      if (!bVar3) {
        return (AWeapon *)this;
      }
    }
    pAVar6 = local_48->ReadyWeapon;
  }
  return pAVar6;
}

Assistant:

AWeapon *FWeaponSlots::PickNextWeapon(player_t *player)
{
	int startslot, startindex;
	int slotschecked = 0;

	if (player->mo == NULL)
	{
		return NULL;
	}
	if (player->ReadyWeapon == NULL || FindMostRecentWeapon(player, &startslot, &startindex))
	{
		int slot;
		int index;

		if (player->ReadyWeapon == NULL)
		{
			startslot = NUM_WEAPON_SLOTS - 1;
			startindex = Slots[startslot].Size() - 1;
		}

		slot = startslot;
		index = startindex;
		do
		{
			if (++index >= Slots[slot].Size())
			{
				index = 0;
				slotschecked++;
				if (++slot >= NUM_WEAPON_SLOTS)
				{
					slot = 0;
				}
			}
			PClassWeapon *type = Slots[slot].GetWeapon(index);
			AWeapon *weap = static_cast<AWeapon *>(player->mo->FindInventory(type));
			if (weap != NULL && weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
		while ((slot != startslot || index != startindex) && slotschecked <= NUM_WEAPON_SLOTS);
	}
	return player->ReadyWeapon;
}